

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginManager.cpp
# Opt level: O0

void __thiscall PluginManager::~PluginManager(PluginManager *this)

{
  PluginManager *this_local;
  
  ~PluginManager(this);
  operator_delete(this,0x78);
  return;
}

Assistant:

PluginManager::~PluginManager()
{
	// The creation and destruction of the concrete plugin MUST be done inside it's shared lib.
	m_plugins.clear();
	for ( auto [filename, handle] : m_handles )
	{
		UNLOAD_HANDLE( m_handles.at( filename ) );
	}
	m_handles.clear();
}